

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::DBTest_RecoverWithLargeLog_Test::~DBTest_RecoverWithLargeLog_Test
          (DBTest_RecoverWithLargeLog_Test *this)

{
  DBTest::~DBTest(&this->super_DBTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, RecoverWithLargeLog) {
  {
    Options options = CurrentOptions();
    Reopen(&options);
    ASSERT_LEVELDB_OK(Put("big1", std::string(200000, '1')));
    ASSERT_LEVELDB_OK(Put("big2", std::string(200000, '2')));
    ASSERT_LEVELDB_OK(Put("small3", std::string(10, '3')));
    ASSERT_LEVELDB_OK(Put("small4", std::string(10, '4')));
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
  }

  // Make sure that if we re-open with a small write buffer size that
  // we flush table files in the middle of a large log file.
  Options options = CurrentOptions();
  options.write_buffer_size = 100000;
  Reopen(&options);
  ASSERT_EQ(NumTableFilesAtLevel(0), 3);
  ASSERT_EQ(std::string(200000, '1'), Get("big1"));
  ASSERT_EQ(std::string(200000, '2'), Get("big2"));
  ASSERT_EQ(std::string(10, '3'), Get("small3"));
  ASSERT_EQ(std::string(10, '4'), Get("small4"));
  ASSERT_GT(NumTableFilesAtLevel(0), 1);
}